

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall
CLI::ExtrasError::ExtrasError
          (ExtrasError *this,string *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  size_type sVar1;
  char *__lhs;
  char *delim;
  allocator<char> local_a1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  string *name_local;
  ExtrasError *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)name;
  name_local = (string *)this;
  ::std::__cxx11::string::string
            ((string *)&local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  delim = "The following arguments were not expected: ";
  __lhs = "The following argument was not expected: ";
  if (1 < sVar1) {
    __lhs = "The following arguments were not expected: ";
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0," ",&local_a1);
  detail::rjoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_80,(detail *)args,&local_a0,(string *)delim);
  ::std::operator+(&local_60,__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80);
  ExtrasError(this,&local_40,(string *)&local_60,ExtrasError);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::allocator<char>::~allocator(&local_a1);
  ::std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

ExtrasError(const std::string &name, std::vector<std::string> args)
        : ExtrasError(name,
                      (args.size() > 1 ? "The following arguments were not expected: "
                                       : "The following argument was not expected: ") +
                          detail::rjoin(args, " "),
                      ExitCodes::ExtrasError) {}